

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CThumbInstruction.cpp
# Opt level: O0

void __thiscall
CThumbInstruction::CThumbInstruction
          (CThumbInstruction *this,tThumbOpcode *sourceOpcode,ThumbOpcodeVariables *vars)

{
  char *pcVar1;
  undefined2 uVar2;
  int iVar3;
  ThumbOpcodeVariables *vars_local;
  tThumbOpcode *sourceOpcode_local;
  CThumbInstruction *this_local;
  
  ArmOpcodeCommand::ArmOpcodeCommand(&this->super_ArmOpcodeCommand);
  (this->super_ArmOpcodeCommand).super_CAssemblerCommand._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CThumbInstruction_002a66a0;
  ThumbOpcodeVariables::ThumbOpcodeVariables(&this->Vars);
  uVar2 = *(undefined2 *)&sourceOpcode->field_0x12;
  iVar3 = sourceOpcode->flags;
  (this->Opcode).encoding = sourceOpcode->encoding;
  *(undefined2 *)&(this->Opcode).field_0x12 = uVar2;
  (this->Opcode).flags = iVar3;
  pcVar1 = sourceOpcode->mask;
  (this->Opcode).name = sourceOpcode->name;
  (this->Opcode).mask = pcVar1;
  ThumbOpcodeVariables::operator=(&this->Vars,vars);
  iVar3 = 2;
  if (((this->Opcode).flags & 0x1000U) != 0) {
    iVar3 = 4;
  }
  this->OpcodeSize = (long)iVar3;
  return;
}

Assistant:

CThumbInstruction::CThumbInstruction(const tThumbOpcode& sourceOpcode, ThumbOpcodeVariables& vars)
{
	this->Opcode = sourceOpcode;
	this->Vars = vars;
	
	OpcodeSize = Opcode.flags & THUMB_LONG ? 4 : 2;
}